

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2shape_index.h
# Opt level: O0

int __thiscall EncodedS2ShapeIndex::max_cell_cache_size(EncodedS2ShapeIndex *this)

{
  size_t sVar1;
  EncodedS2ShapeIndex *this_local;
  
  sVar1 = s2coding::EncodedS2CellIdVector::size(&this->cell_ids_);
  return (int)(sVar1 >> 0xb);
}

Assistant:

inline int EncodedS2ShapeIndex::max_cell_cache_size() const {
  // The cell cache is sized so that scanning decoded_cells_ in the destructor
  // costs about 30 cycles per decoded cell in the worst case.  (This overhead
  // is acceptable relative to the other costs of decoding each cell.)
  //
  // For example, if there are 65,536 cells then we won't need to scan
  // encoded_cells_ unless we decode at least (65536/2048) == 32 cells.  It
  // takes about 1 cycle per 64 cells to scan encoded_cells_, so that works
  // out to (65536/64) == 1024 cycles.  However this cost is amortized over
  // the 32 cells decoded, which works out to 32 cycles per cell.
  return cell_ids_.size() >> 11;
}